

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O1

void __thiscall pg::SPMSolver::run(SPMSolver *this)

{
  uint64_t *puVar1;
  char cVar2;
  bool bVar3;
  iterator iVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  ostream *poVar12;
  Game *pGVar13;
  Error *this_00;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  int iVar17;
  int from;
  ulong uVar18;
  uint uVar19;
  char *pcVar20;
  int *piVar21;
  bool bVar22;
  long lVar23;
  int *piVar24;
  int from_1;
  uint uVar25;
  uint *puVar26;
  uint *puVar27;
  int n;
  vector<int,_std::allocator<int>_> cycles;
  queue<int,_std::deque<int,_std::allocator<int>_>_> cm_queue;
  uint local_10c;
  int *local_108;
  int local_fc;
  int *local_f8;
  uint local_ec;
  uint *local_e8;
  iterator iStack_e0;
  int *local_d8;
  ulong local_c8;
  uint local_bc;
  int *local_b8;
  ulong local_b0;
  long local_a8;
  SPMSolver *local_a0;
  _Deque_base<int,_std::allocator<int>_> local_98;
  int64_t *local_48;
  char *local_40;
  long local_38;
  
  pGVar13 = (this->super_Solver).game;
  lVar15 = pGVar13->n_vertices;
  uVar6 = *(uint *)((long)pGVar13->_priority + ((lVar15 << 0x20) + -0x100000000 >> 0x1e));
  local_b0 = (ulong)uVar6;
  iVar17 = 2;
  if (0 < (int)uVar6) {
    iVar17 = uVar6 + 1;
  }
  lVar23 = (long)iVar17;
  this->k = lVar23;
  uVar8 = lVar15 * lVar23;
  local_f8 = (int *)operator_new__(-(ulong)(uVar8 >> 0x3e != 0) | uVar8 * 4);
  this->pms = local_f8;
  local_b8 = (int *)operator_new__(-(ulong)((ulong)pGVar13->n_vertices >> 0x3e != 0) |
                                   pGVar13->n_vertices << 2);
  this->strategy = local_b8;
  uVar8 = 0xffffffffffffffff;
  if (-1 < iVar17) {
    uVar8 = lVar23 * 4;
  }
  piVar9 = (int *)operator_new__(uVar8);
  this->counts = piVar9;
  piVar10 = (int *)operator_new__(uVar8);
  this->tmp = piVar10;
  piVar10 = (int *)operator_new__(uVar8);
  this->best = piVar10;
  local_108 = (int *)operator_new__(-(ulong)((ulong)pGVar13->n_vertices >> 0x3e != 0) |
                                    pGVar13->n_vertices << 2);
  this->dirty = local_108;
  piVar10 = (int *)operator_new__(-(ulong)((ulong)pGVar13->n_vertices >> 0x3e != 0) |
                                  pGVar13->n_vertices << 2);
  this->unstable = piVar10;
  uVar8 = pGVar13->n_vertices;
  if (0 < (long)(lVar23 * uVar8)) {
    memset(local_f8,0,lVar23 * uVar8 * 4);
  }
  if (0 < (long)uVar8) {
    memset(local_b8,0xff,uVar8 * 4);
  }
  if (0 < iVar17) {
    uVar11 = 1;
    if (1 < (int)local_b0) {
      uVar11 = local_b0 & 0xffffffff;
    }
    memset(piVar9,0,uVar11 * 4 + 4);
  }
  if (0 < (long)uVar8) {
    puVar1 = ((this->super_Solver).disabled)->_bits;
    uVar11 = 0;
    do {
      if ((puVar1[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
        piVar9[pGVar13->_priority[uVar11]] = piVar9[pGVar13->_priority[uVar11]] + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar8 != uVar11);
  }
  if (iVar17 < 1) {
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = 0xffffffff;
    uVar18 = (ulong)(iVar17 - 1);
    do {
      if (piVar9[uVar18] != 0) {
        uVar14 = uVar11;
        if ((int)uVar11 == -1) {
          uVar14 = uVar18 & 0xffffffff;
        }
        if ((uVar18 & 1) != 0) {
          uVar11 = uVar14;
        }
        uVar6 = -(uint)((uVar18 & 1) != 0) | (uint)uVar18;
        local_c8 = (ulong)uVar6;
        if (uVar6 != 0xffffffff) goto LAB_0016a463;
      }
      bVar5 = 0 < (long)uVar18;
      uVar18 = uVar18 - 1;
    } while (bVar5);
  }
  local_c8 = 0xffffffff;
LAB_0016a463:
  if (0 < (long)uVar8) {
    memset(local_108,0,uVar8 * 4);
  }
  uVar18 = 0xffffffffffffffff;
  if (uVar8 < 0x4000000000000000) {
    uVar18 = uVar8 * 4;
  }
  piVar9 = (int *)operator_new__(uVar18);
  if (0 < pGVar13->n_vertices) {
    memset(piVar9,0,pGVar13->n_vertices << 2);
  }
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_98,0);
  local_e8 = (uint *)0x0;
  iStack_e0._M_current = (int *)0x0;
  local_d8 = (int *)0x0;
  this->lift_attempt = 0;
  this->lift_count = 0;
  uVar6 = (int)((this->super_Solver).game)->n_vertices - 1;
  if (-1 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
        bVar5 = lift(this,(int)uVar8,-1);
        if (bVar5) {
          pGVar13 = (this->super_Solver).game;
          piVar10 = pGVar13->_inedges;
          lVar15 = (long)pGVar13->_firstins[uVar8];
          iVar17 = piVar10[lVar15];
          if (iVar17 != -1) {
            piVar10 = piVar10 + lVar15 + 1;
            do {
              if (((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar17 >> 6] >>
                    ((long)iVar17 & 0x3fU) & 1) == 0) &&
                 (bVar5 = lift(this,iVar17,(int)uVar8), bVar5)) {
                todo_push(this,iVar17);
              }
              iVar17 = *piVar10;
              piVar10 = piVar10 + 1;
            } while (iVar17 != -1);
          }
        }
      }
      bVar5 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar5);
  }
  local_48 = &this->lift_attempt;
  local_a8 = 0;
  local_f8 = piVar9;
  local_a0 = this;
  do {
    while ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_cur !=
           (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
           _M_start._M_cur) {
      iVar7 = todo_pop(this);
      pGVar13 = (this->super_Solver).game;
      piVar10 = pGVar13->_inedges;
      lVar15 = (long)pGVar13->_firstins[iVar7];
      iVar17 = piVar10[lVar15];
      if (iVar17 != -1) {
        piVar10 = piVar10 + lVar15 + 1;
        do {
          if (((((this->super_Solver).disabled)->_bits[(ulong)(long)iVar17 >> 6] >>
                ((long)iVar17 & 0x3fU) & 1) == 0) && (bVar5 = lift(this,iVar17,iVar7), bVar5)) {
            todo_push(this,iVar17);
          }
          iVar17 = *piVar10;
          piVar10 = piVar10 + 1;
        } while (iVar17 != -1);
      }
      lVar15 = this->lift_count;
      if (local_a8 + ((this->super_Solver).game)->n_vertices * 10 < lVar15) {
        update(this,0);
        update(this,1);
        local_a8 = lVar15;
      }
    }
    if ((1 < (this->super_Solver).trace) && (0 < ((this->super_Solver).game)->n_vertices)) {
      uVar8 = 0;
      do {
        if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
          poVar12 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"\x1b[35m**\x1b[m \x1b[1mnode ",0x14);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
          poVar12 = (ostream *)
                    std::ostream::operator<<(poVar12,((this->super_Solver).game)->_priority[uVar8]);
          bVar5 = ((((this->super_Solver).game)->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) !=
                  0;
          pcVar20 = " (odd)";
          if (!bVar5) {
            pcVar20 = " (even)";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar20,7 - (ulong)bVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m is",6);
          pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar8);
          poVar12 = (this->super_Solver).logger;
          cVar2 = (char)poVar12;
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < ((this->super_Solver).game)->n_vertices);
    }
    piVar10 = (int *)0x0;
    do {
      if (0 < this->k) {
        memset(this->best,0,this->k << 2);
      }
      local_bc = (uint)uVar11;
      if (piVar10 == (int *)0x0) {
        local_bc = (uint)local_c8;
      }
      local_10c = 0;
      local_108 = piVar10;
      local_b0 = uVar11;
      if (((this->super_Solver).game)->n_vertices < 1) {
        local_fc = -1;
        local_ec = 0xffffffff;
      }
      else {
        local_40 = " odd";
        if (piVar10 == (int *)0x0) {
          local_40 = " even";
        }
        local_40 = local_40 + 1;
        local_38 = (ulong)(piVar10 == (int *)0x0) + 3;
        local_ec = 0xffffffff;
        uVar8 = 0;
        local_fc = -1;
        do {
          if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
            piVar10 = this->pms + uVar8 * this->k;
            if (piVar10[(long)local_108] != -1) {
              uVar6 = (uint)this->k;
              uVar6 = ~(uint)((int *)(ulong)(uVar6 & 1) == local_108) + uVar6;
              uVar25 = 0xffffffff;
              if (-1 < (int)uVar6) {
                do {
                  uVar25 = uVar6;
                  if (this->counts[uVar6] < piVar10[uVar6]) break;
                  bVar5 = 1 < (int)uVar6;
                  uVar6 = uVar6 - 2;
                  uVar25 = 0xffffffff;
                } while (bVar5);
              }
              if (uVar25 != 0xffffffff) {
                if (1 < (this->super_Solver).trace) {
                  poVar12 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[31;1m",7);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_40,local_38);
                  bVar5 = local_108 ==
                          (int *)(ulong)(((((this->super_Solver).game)->_owner)._bits
                                          [(ulong)(long)(int)local_10c >> 6] >>
                                          ((long)(int)local_10c & 0x3fU) & 1) != 0);
                  pcVar20 = " loser ";
                  if (bVar5) {
                    pcVar20 = " winner ";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,pcVar20,(ulong)bVar5 + 7);
                  poVar12 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"loops\x1b[m: ",10);
                  poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_10c);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
                  poVar12 = (ostream *)
                            std::ostream::operator<<
                                      (poVar12,((this->super_Solver).game)->_priority
                                               [(int)local_10c]);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," (cm = ",7);
                  uVar6 = (uint)this->k;
                  uVar6 = ~(uint)((int *)(ulong)(uVar6 & 1) == local_108) + uVar6;
                  uVar19 = 0xffffffff;
                  if (-1 < (int)uVar6) {
                    do {
                      uVar19 = uVar6;
                      if (this->counts[uVar6] < piVar10[uVar6]) break;
                      bVar5 = 1 < (int)uVar6;
                      uVar6 = uVar6 - 2;
                      uVar19 = 0xffffffff;
                    } while (bVar5);
                  }
                  poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar19);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,")",1);
                  pm_stream(this,(this->super_Solver).logger,piVar10);
                  poVar12 = (this->super_Solver).logger;
                  cVar2 = (char)poVar12;
                  std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar2);
                  std::ostream::put(cVar2);
                  std::ostream::flush();
                }
                if (uVar25 == local_bc) {
                  this->pms[(long)((long)(int)local_10c * this->k + (long)local_108)] = -1;
                  todo_push(this,local_10c);
                  uVar6 = ((this->super_Solver).game)->_priority[(int)local_10c];
                  if (local_108 == (int *)(ulong)(uVar6 & 1)) {
                    this->counts[(int)uVar6] = this->counts[(int)uVar6] + -1;
                  }
                  if ((this->super_Solver).trace != 0) {
                    poVar12 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,"\x1b[1;36mupdated node ",0x14);
                    poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_10c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
                    poVar12 = (ostream *)
                              std::ostream::operator<<
                                        (poVar12,((this->super_Solver).game)->_priority
                                                 [(int)local_10c]);
                    bVar5 = ((((this->super_Solver).game)->_owner)._bits
                             [(ulong)(long)(int)local_10c >> 6] >> ((long)(int)local_10c & 0x3fU) &
                            1) != 0;
                    pcVar20 = " (odd)";
                    if (!bVar5) {
                      pcVar20 = " (even)";
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,pcVar20,7 - (ulong)bVar5);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m to",6);
                    pm_stream(this,(this->super_Solver).logger,
                              this->pms + (long)(int)local_10c * this->k);
                    poVar12 = (this->super_Solver).logger;
                    cVar2 = (char)poVar12;
                    std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar2);
                    std::ostream::put(cVar2);
                    std::ostream::flush();
                  }
                }
                else {
                  if (iStack_e0._M_current == local_d8) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_e8,iStack_e0,
                               (int *)&local_10c);
                  }
                  else {
                    *iStack_e0._M_current = local_10c;
                    iStack_e0._M_current = iStack_e0._M_current + 1;
                  }
                  uVar8 = (ulong)(int)local_10c;
                  pGVar13 = (this->super_Solver).game;
                  if (local_108 !=
                      (int *)(ulong)(((pGVar13->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) !=
                                    0)) {
                    iVar17 = pGVar13->_outedges[pGVar13->_firstouts[uVar8]];
                    if (iVar17 != -1) {
                      local_b8 = (int *)CONCAT44(local_b8._4_4_,pGVar13->_priority[uVar8]);
                      piVar10 = pGVar13->_outedges + pGVar13->_firstouts[uVar8];
                      do {
                        uVar8 = (ulong)iVar17;
                        if (((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) &
                             1) == 0) &&
                           (piVar9 = local_f8, (this->pms + uVar8 * this->k)[(long)local_108] != -1)
                           ) {
                          iVar7 = (int)local_108;
                          Prog(this,this->tmp,this->pms + uVar8 * this->k,(int)local_b8,iVar7);
                          piVar24 = this->tmp;
                          lVar15 = this->k;
                          bVar5 = pm_less(this,this->pms + (int)local_10c * lVar15,piVar24,
                                          (int)local_b8,iVar7);
                          this = local_a0;
                          piVar9 = local_f8;
                          if ((bVar5) &&
                             ((local_fc == -1 ||
                              (bVar5 = pm_less(local_a0,piVar24,local_a0->best,0,(int)local_108),
                              bVar5)))) {
                            if ((long)local_108 < lVar15) {
                              piVar21 = this->best;
                              piVar16 = local_108;
                              do {
                                piVar21[(long)piVar16] = piVar24[(long)piVar16];
                                piVar16 = (int *)((long)piVar16 + 2);
                              } while ((long)piVar16 < lVar15);
                            }
                            local_ec = local_10c;
                            local_fc = iVar17;
                          }
                        }
                        iVar17 = piVar10[1];
                        piVar10 = piVar10 + 1;
                        uVar11 = local_b0;
                      } while (iVar17 != -1);
                    }
                  }
                }
              }
            }
          }
          uVar8 = (long)(int)local_10c + 1;
          local_10c = (uint)uVar8;
        } while ((long)uVar8 < ((this->super_Solver).game)->n_vertices);
      }
      iVar4._M_current = iStack_e0._M_current;
      uVar6 = local_ec;
      piVar24 = local_108;
      puVar27 = local_e8;
      if (local_fc == -1) {
        for (; puVar26 = local_e8, puVar27 != (uint *)iStack_e0._M_current; puVar27 = puVar27 + 1) {
          *(undefined4 *)((long)piVar9 + (long)(int)*puVar27 * 4) = 1;
        }
        for (; puVar26 != (uint *)iVar4._M_current; puVar26 = puVar26 + 1) {
          local_10c = *puVar26;
          uVar8 = (ulong)(int)local_10c;
          pGVar13 = (this->super_Solver).game;
          piVar10 = pGVar13->_outedges;
          lVar15 = (long)pGVar13->_firstouts[uVar8];
          iVar17 = piVar10[lVar15];
          if (piVar24 ==
              (int *)(ulong)(((pGVar13->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)) {
            if (iVar17 == -1) {
              bVar5 = true;
            }
            else {
              piVar10 = piVar10 + lVar15 + 1;
              bVar22 = true;
              do {
                uVar11 = (ulong)iVar17;
                if ((((this->super_Solver).disabled)->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) ==
                    0) {
                  bVar5 = false;
                  bVar3 = false;
                  if (*(int *)((long)piVar9 + uVar11 * 4) == 0) goto LAB_0016af63;
                }
                else {
LAB_0016af63:
                  bVar3 = true;
                  bVar5 = bVar22;
                }
                if (!bVar3) break;
                iVar17 = *piVar10;
                piVar10 = piVar10 + 1;
                bVar22 = bVar5;
              } while (iVar17 != -1);
            }
          }
          else if (iVar17 == -1) {
            bVar5 = false;
          }
          else {
            piVar10 = piVar10 + lVar15 + 1;
            bVar5 = false;
            do {
              uVar11 = (ulong)iVar17;
              if ((((((this->super_Solver).disabled)->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) ==
                    0) && (this->pms[(long)((long)piVar24 + this->k * uVar11)] != -1)) &&
                 (*(int *)((long)piVar9 + uVar11 * 4) == 0)) {
                bVar5 = true;
                bVar22 = false;
              }
              else {
                bVar22 = true;
              }
              if (!bVar22) break;
              iVar17 = *piVar10;
              piVar10 = piVar10 + 1;
            } while (iVar17 != -1);
          }
          if (bVar5) {
            *(undefined4 *)((long)piVar9 + uVar8 * 4) = 0;
            if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                        ((deque<int,std::allocator<int>> *)&local_98,(int *)&local_10c);
            }
            else {
              *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = local_10c;
              local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
        while (iVar4._M_current = iStack_e0._M_current, puVar27 = local_e8, uVar11 = local_b0,
              local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
              local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
          uVar6 = *local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_98._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_98._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_98._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_98._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_98._M_impl.super__Deque_impl_data._M_start._M_last =
                 (_Elt_pointer)
                 ((uint *)local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
            local_98._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_98._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_98._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_98._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_98._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
          pGVar13 = (this->super_Solver).game;
          piVar10 = pGVar13->_inedges;
          iVar17 = pGVar13->_firstins[(int)uVar6];
          if (piVar10[iVar17] != -1) {
            puVar27 = (uint *)(piVar10 + iVar17);
            do {
              local_10c = *puVar27;
              uVar8 = (ulong)(int)local_10c;
              puVar1 = ((this->super_Solver).disabled)->_bits;
              if (((puVar1[uVar8 >> 6] >> (local_10c & 0x3f) & 1) == 0) &&
                 (*(int *)((long)piVar9 + uVar8 * 4) != 0)) {
                pGVar13 = (this->super_Solver).game;
                if (piVar24 ==
                    (int *)(ulong)(((pGVar13->_owner)._bits[uVar8 >> 6] >> (local_10c & 0x3f) & 1)
                                  != 0)) {
                  iVar17 = pGVar13->_outedges[pGVar13->_firstouts[uVar8]];
                  if (iVar17 != -1) {
                    piVar10 = pGVar13->_outedges + (long)pGVar13->_firstouts[uVar8] + 1;
                    bVar5 = false;
                    do {
                      uVar11 = (ulong)iVar17;
                      if (((puVar1[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) &&
                         (*(int *)((long)piVar9 + uVar11 * 4) != 0)) {
                        bVar5 = true;
                        bVar22 = false;
                      }
                      else {
                        bVar22 = true;
                      }
                      if (!bVar22) break;
                      iVar17 = *piVar10;
                      piVar10 = piVar10 + 1;
                    } while (iVar17 != -1);
                    if (bVar5) goto LAB_0016b0fa;
                  }
                }
                *(undefined4 *)((long)piVar9 + uVar8 * 4) = 0;
                if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                            ((deque<int,std::allocator<int>> *)&local_98,(int *)&local_10c);
                }
                else {
                  *local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = local_10c;
                  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
              }
LAB_0016b0fa:
              puVar26 = puVar27 + 1;
              puVar27 = puVar27 + 1;
            } while (*puVar26 != 0xffffffff);
          }
        }
        for (; piVar24 = local_108, local_108 = piVar24, local_b0 = uVar11,
            puVar27 != (uint *)iVar4._M_current; puVar27 = puVar27 + 1) {
          uVar6 = *puVar27;
          uVar8 = (ulong)(int)uVar6;
          if (*(int *)((long)piVar9 + uVar8 * 4) != 0) {
            *(undefined4 *)((long)piVar9 + uVar8 * 4) = 0;
            this->pms[(long)(this->k * uVar8 + (long)piVar24)] = -1;
            todo_push(this,uVar6);
            piVar9 = local_f8;
            uVar25 = ((this->super_Solver).game)->_priority[uVar8];
            if (piVar24 == (int *)(ulong)(uVar25 & 1)) {
              this->counts[(int)uVar25] = this->counts[(int)uVar25] + -1;
            }
            if ((this->super_Solver).trace != 0) {
              poVar12 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar12,"\x1b[1;36mupdated node ",0x14);
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
              poVar12 = (ostream *)
                        std::ostream::operator<<
                                  (poVar12,((this->super_Solver).game)->_priority[uVar8]);
              bVar5 = ((((this->super_Solver).game)->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1
                      ) != 0;
              pcVar20 = " (odd)";
              if (!bVar5) {
                pcVar20 = " (even)";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar20,7 - (ulong)bVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m to",6);
              pm_stream(this,(this->super_Solver).logger,this->pms + uVar8 * this->k);
              poVar12 = (this->super_Solver).logger;
              cVar2 = (char)poVar12;
              std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar2);
              std::ostream::put(cVar2);
              std::ostream::flush();
            }
          }
          uVar11 = local_b0;
        }
        if ((uint *)iStack_e0._M_current != local_e8) goto LAB_0016ae9d;
      }
      else {
        uVar8 = (ulong)(int)local_ec;
        this->strategy[uVar8] = local_fc;
        lVar15 = this->k;
        if ((long)local_108 < lVar15) {
          piVar9 = this->best;
          piVar10 = this->pms;
          piVar21 = local_108;
          do {
            piVar10[(long)(lVar15 * uVar8 + (long)piVar21)] = piVar9[(long)piVar21];
            piVar21 = (int *)((long)piVar21 + 2);
          } while ((long)piVar21 < lVar15);
        }
        todo_push(this,local_ec);
        if ((this->super_Solver).trace != 0) {
          poVar12 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[1;36mupdated node ",0x14)
          ;
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,uVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
          poVar12 = (ostream *)
                    std::ostream::operator<<(poVar12,((this->super_Solver).game)->_priority[uVar8]);
          bVar5 = ((((this->super_Solver).game)->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) !=
                  0;
          pcVar20 = " (odd)";
          if (!bVar5) {
            pcVar20 = " (even)";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar20,7 - (ulong)bVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m to",6);
          pm_stream(this,(this->super_Solver).logger,this->pms + uVar8 * this->k);
          poVar12 = (this->super_Solver).logger;
          cVar2 = (char)poVar12;
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        if ((uint *)iStack_e0._M_current != local_e8) {
LAB_0016ae9d:
          iStack_e0._M_current = (int *)local_e8;
        }
      }
      if (this->counts[(int)local_bc] == 0) {
        if (1 < (this->super_Solver).trace) {
          poVar12 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"\x1b[1mlowering max\x1b[m for player ",0x1f);
          pcVar20 = " odd";
          if (piVar24 == (int *)0x0) {
            pcVar20 = " even";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,pcVar20 + 1,(ulong)(piVar24 == (int *)0x0) + 3);
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
        }
        if (piVar24 == (int *)0x0) {
          if (0 < (int)(uint)local_c8) {
            do {
              iVar17 = (int)local_c8;
              if (this->counts[local_c8 & 0xffffffff] != 0) goto LAB_0016aeb5;
              uVar6 = iVar17 - 2;
              local_c8 = (ulong)uVar6;
            } while (2 < iVar17);
            local_c8 = (ulong)uVar6;
          }
        }
        else if (0 < (int)uVar11) {
          do {
            iVar17 = (int)uVar11;
            if (this->counts[uVar11 & 0xffffffff] != 0) goto LAB_0016aeb5;
            uVar6 = iVar17 - 2;
            uVar11 = (ulong)uVar6;
          } while (2 < iVar17);
          uVar11 = (ulong)uVar6;
        }
      }
LAB_0016aeb5:
      piVar9 = local_f8;
      piVar10 = (int *)((long)piVar24 + 1);
    } while (piVar24 == (int *)0x0);
    if ((this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
        _M_start._M_cur) {
      if ((1 < (this->super_Solver).trace) && (0 < ((this->super_Solver).game)->n_vertices)) {
        uVar8 = 0;
        do {
          if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
            poVar12 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\x1b[35m**\x1b[m \x1b[1mnode ",0x14);
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"/",1);
            poVar12 = (ostream *)
                      std::ostream::operator<<
                                (poVar12,((this->super_Solver).game)->_priority[uVar8]);
            bVar5 = ((((this->super_Solver).game)->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1)
                    != 0;
            pcVar20 = " (odd)";
            if (!bVar5) {
              pcVar20 = " (even)";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar20,7 - (ulong)bVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m is",6);
            pm_stream(this,(this->super_Solver).logger,this->pms + this->k * uVar8);
            poVar12 = (this->super_Solver).logger;
            cVar2 = (char)poVar12;
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar2);
            std::ostream::put(cVar2);
            std::ostream::flush();
          }
          uVar8 = uVar8 + 1;
        } while ((long)uVar8 < ((this->super_Solver).game)->n_vertices);
      }
      pGVar13 = (this->super_Solver).game;
      if (0 < pGVar13->n_vertices) {
        uVar8 = 0;
        do {
          if ((((this->super_Solver).disabled)->_bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) == 0) {
            lVar15 = this->k * uVar8;
            iVar17 = this->pms[lVar15];
            if ((iVar17 == -1) != (this->pms[lVar15 + 1] != -1)) {
              this_00 = (Error *)__cxa_allocate_exception(0x40);
              Error::Error(this_00,"logic error",
                           "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/spm.cpp"
                           ,0x273);
              __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
            }
            iVar7 = -1;
            if ((((pGVar13->_owner)._bits[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0) == (iVar17 != -1)
               ) {
              iVar7 = this->strategy[uVar8];
            }
            Oink::solve((this->super_Solver).oink,(int)uVar8,(uint)(iVar17 != -1),iVar7);
          }
          uVar8 = uVar8 + 1;
          pGVar13 = (this->super_Solver).game;
        } while ((long)uVar8 < pGVar13->n_vertices);
      }
      if (this->pms != (int *)0x0) {
        operator_delete__(this->pms);
      }
      if (this->strategy != (int *)0x0) {
        operator_delete__(this->strategy);
      }
      if (this->counts != (int *)0x0) {
        operator_delete__(this->counts);
      }
      if (this->tmp != (int *)0x0) {
        operator_delete__(this->tmp);
      }
      if (this->best != (int *)0x0) {
        operator_delete__(this->best);
      }
      if (this->dirty != (int *)0x0) {
        operator_delete__(this->dirty);
      }
      operator_delete__(piVar9);
      if (this->unstable != (int *)0x0) {
        operator_delete__(this->unstable);
      }
      poVar12 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"solved with ",0xc);
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," lifts, ",8);
      poVar12 = std::ostream::_M_insert<long>((long)poVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12," lift attempts.",0xf);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      if (local_e8 != (uint *)0x0) {
        operator_delete(local_e8,(long)local_d8 - (long)local_e8);
      }
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_98);
      return;
    }
  } while( true );
}

Assistant:

void
SPMSolver::run()
{
    // determine k = highest priority + 1
    k = priority(nodecount()-1)+1;
    if (k < 2) k = 2;

    // now create the data structure, for each node
    pms = new int[(size_t)k*nodecount()];
    strategy = new int[nodecount()];
    counts = new int[k];
    tmp = new int[k];
    best = new int[k];
    dirty = new int[nodecount()];
    unstable = new int[nodecount()];

    int max0 = -1, max1 = -1;

    // initialize all measures to 0
    for (int i=0; i<k*nodecount(); i++) pms[i] = 0;

    // initialize strategy to -1
    for (int i=0; i<nodecount(); i++) strategy[i] = -1;

    // initialize counts for each priority
    for (int i=0; i<k; i++) counts[i] = 0;
    for (int i=0; i<nodecount(); i++) if (disabled[i] == 0) counts[priority(i)]++;
    for (int i=k-1; i>=0; i--) {
        if (counts[i] == 0) continue;
        if (i&1) { if (max1 == -1) max1 = i; }
        else { if (max0 == -1) max0 = i; }
        if (max0 != -1 and max0 != -1) break;
    }

    // initialize all nodes as not dirty
    for (int n=0; n<nodecount(); n++) dirty[n] = 0;

    // allocate and initialize additional array for cycle measures
    int *cm = new int[nodecount()];
    for (int n=0; n<nodecount(); n++) cm[n] = 0;

    // a queue and a vector for cycle measure analysis
    std::queue<int> cm_queue;
    std::vector<int> cycles;

    // set number of lifts and lift attempts to 0
    lift_count = lift_attempt = 0;

    /**
     * Strategy that updates predecessors then marks updated predecessors for processing.
     * Uses a queue to store the dirty vertices.
     */

    /**
     * Initialization loop.
     */

    for (int n=nodecount()-1; n>=0; n--) {
        if (!disabled[n] and lift(n, -1)) {
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
        }
    }
    
    /**
     * The main loop.
     */

    int64_t last_update = 0;

    while (true) {
        while (!todo.empty()) {
            int n = todo_pop();
            for (auto curedge = ins(n); *curedge != -1; curedge++) {
                int from = *curedge;
                if (!disabled[from] and lift(from, n)) todo_push(from);
            }
            if (last_update + 10*nodecount() < lift_count) {
                last_update = lift_count;
                update(0);
                update(1);
            }
        }

#ifndef NDEBUG
        if (trace >= 2) {
            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
                pm_stream(logger, pms + k*n);
                logger << std::endl;
            }
        }
#endif

        /**
         * End of the main loop.
         * When no more lifting occurs, we must analyze nodes with cyclic measures.
         * We analyze for player 0 first, then for player 1.
         */

        for (int pl=0; pl<2; pl++) {
            /**
             * Put all nodes with cycle measures in "cycles"
             * Also find the best (lowest) exit for the loser
             */
            int best_from = -1, best_to = -1;
            for (int i=0; i<k; i++) best[i] = 0;

            int max = pl == 0 ? max0 : max1;

            for (int n=0; n<nodecount(); n++) {
                if (disabled[n]) continue;
                int *pm = pms + k*n;
                if (pm[pl] == -1) continue; // already won
                int c = pm_cycles(pm, pl);
                if (c == -1) continue; // not a cycle measure
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "\033[31;1m" << (pl ? "odd" : "even") << (pl == owner(n) ? " winner " : " loser ");
                    logger << "loops\033[m: " << n << "/" << priority(n) << " (cm = " << pm_cycles(pm, pl) << ")";
                    pm_stream(logger, pm);
                    logger << std::endl;
                }
#endif
                if (c == max) {
                    pms[n*k + pl] = -1;
                    todo_push(n);

                    const int d = priority(n);
                    if ((d&1) == pl) counts[d]--;

                    if (trace) {
                        logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                        pm_stream(logger, pms + n*k);
                        logger << std::endl;
                    }

                    continue;
                }

                cycles.push_back(n);
                if (owner(n) != pl) {
                    const int d = priority(n);
                    for (auto curedge = outs(n); *curedge != -1; curedge++) {
                        int to = *curedge;
                        if (disabled[to]) continue;
                        int *pm_to = pms + k*to;
                        if (pm_to[pl] == -1) continue; // already won
                        Prog(tmp, pm_to, d, pl);
                        if (!pm_less(pms + k*n, tmp, d, pl)) continue; // candidate must increase measure
                        if (best_to == -1 or pm_less(tmp, best, 0, pl))  {
                            for (int i=pl; i<k; i+=2) best[i] = tmp[i];
                            best_from = n;
                            best_to = to;
                        }
                    }
                }
            }

            if (best_to != -1) {
                /**
                 * OK we found the best exit from <best_from> to <best_to>.
                 */
                strategy[best_from] = best_to;
                pm_copy(pms + best_from*k, best, pl);
                todo_push(best_from);

                if (trace) {
                    logger << "\033[1;36mupdated node " << best_from << "/" << priority(best_from) << (owner(best_from)?" (odd)":" (even)") << "\033[m to";
                    pm_stream(logger, pms + best_from*k);
                    logger << std::endl;
                }

                cycles.clear();
            } else {
                /**
                 * No exit found, everything that remains a cycle after removing escaping nodes is now won.
                 */
                for (int n : cycles) cm[n] = 1; // mark everything in 'cycles'

                for (int n : cycles) {
                    bool escapes;
                    if (owner(n) == pl) {
                        // check if it can stay in cm
                        escapes = true;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and cm[m]) {
                                escapes = false;
                                break;
                            }
                        }
                    } else {
                        // check if it can move out of cm
                        escapes = false;
                        for (auto curedge = outs(n); *curedge != -1; curedge++) {
                            int m = *curedge;
                            if (disabled[m] == 0 and pms[k*m+pl] != -1 and cm[m] == 0) {
                                escapes = true;
                                break;
                            }
                        }
                    }
                    if (escapes) {
                        cm[n] = 0;
                        cm_queue.push(n);
                    }
                }

                /**
                 * Run backwards search to remove nodes that can escape to non-CM
                 */

                while (!cm_queue.empty()) {
                    int n = cm_queue.front();
                    cm_queue.pop();
                    for (auto curedge = ins(n); *curedge != -1; curedge++) {
                        int m = *curedge;
                        if (disabled[m] != 0 or cm[m] == 0) continue;
                        if (owner(m) == pl) {
                            bool escapes = false;
                            for (auto curedge = outs(m); *curedge != -1; curedge++) {
                                int to = *curedge;
                                if (disabled[to] == 0 and cm[to]) {
                                    escapes = true;
                                    break;
                                }
                            }
                            if (escapes) continue;
                        }
                        cm[m] = 0;
                        cm_queue.push(m);
                    }
                }

                /**
                 * Finally, mark remaining nodes as won
                 */

                for (int n : cycles) {
                    if (cm[n]) {
                        cm[n] = 0;
                        pms[n*k + pl] = -1;
                        todo_push(n);

                        const int d = priority(n);
                        if ((d&1) == pl) counts[d]--;

                        if (trace) {
                            logger << "\033[1;36mupdated node " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m to";
                            pm_stream(logger, pms + n*k);
                            logger << std::endl;
                        }
                    }
                }

                cycles.clear();
            }

            if (counts[max] == 0) {
                if (trace >= 2) logger << "\033[1mlowering max\033[m for player " << (pl == 0 ? "even" : "odd") << std::endl;
                if (pl == 0) { while (max0 > 0 and counts[max0] == 0) max0 -= 2; }
                else { while (max1 > 0 and counts[max1] == 0) max1 -= 2; }
            }
        }

        if (todo.empty()) break;
    }

#ifndef NDEBUG
    if (trace >= 2) {
        for (int n=0; n<nodecount(); n++) {
            if (disabled[n]) continue;
            logger << "\033[35m**\033[m \033[1mnode " << n << "/" << priority(n) << (owner(n)?" (odd)":" (even)") << "\033[m is";
            pm_stream(logger, pms + k*n);
            logger << std::endl;
        }
    }
#endif

    // Now set dominions and derive strategy for even.
    for (int n=0; n<nodecount(); n++) {
        if (disabled[n]) continue;
        int *pm = pms + k*n;
        if ((pm[0] == -1) == (pm[1] == -1)) LOGIC_ERROR;
        const int winner = pm[0] == -1 ? 0 : 1;
        Solver::solve(n, winner, owner(n) == winner ? strategy[n] : -1);
    }

    delete[] pms;
    delete[] strategy;
    delete[] counts;
    delete[] tmp;
    delete[] best;
    delete[] dirty;
    delete[] cm;
    delete[] unstable;

    logger << "solved with " << lift_count << " lifts, " << lift_attempt << " lift attempts." << std::endl;
}